

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

cio_error cio_websocket_write_message_first_chunk
                    (cio_websocket *websocket,size_t frame_length,cio_write_buffer *payload,
                    _Bool last_frame,_Bool is_binary,cio_websocket_write_handler_t handler,
                    void *handler_context)

{
  cio_websocket_frame_type local_3c;
  cio_websocket_frame_type kind;
  cio_websocket_write_handler_t handler_local;
  _Bool is_binary_local;
  _Bool last_frame_local;
  cio_write_buffer *payload_local;
  size_t frame_length_local;
  cio_websocket *websocket_local;
  
  if ((websocket == (cio_websocket *)0x0) || (handler == (cio_websocket_write_handler_t)0x0)) {
    websocket_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else if ((websocket->ws_private).write_message_job.wbh == (cio_write_buffer *)0x0) {
    local_3c = CIO_WEBSOCKET_TEXT_FRAME;
    if ((*(ushort *)&(websocket->ws_private).ws_flags >> 0xb & 1) == 1) {
      if (is_binary) {
        local_3c = CIO_WEBSOCKET_BINARY_FRAME;
      }
      if (!last_frame) {
        *(ushort *)&(websocket->ws_private).ws_flags =
             *(ushort *)&(websocket->ws_private).ws_flags & 0xf7ff;
      }
    }
    else {
      if (last_frame) {
        *(ushort *)&(websocket->ws_private).ws_flags =
             *(ushort *)&(websocket->ws_private).ws_flags & 0xf7ff | 0x800;
      }
      local_3c = CIO_WEBSOCKET_CONTINUATION_FRAME;
    }
    (websocket->ws_private).write_message_job.wbh = payload;
    (websocket->ws_private).write_message_job.handler = handler;
    (websocket->ws_private).write_message_job.handler_context = handler_context;
    (websocket->ws_private).write_message_job.frame_type = local_3c;
    (websocket->ws_private).write_message_job.last_frame = last_frame;
    (websocket->ws_private).write_message_job.stream_handler = message_written;
    (websocket->ws_private).write_message_job.is_continuation_chunk = false;
    websocket_local._4_4_ =
         enqueue_job(websocket,&(websocket->ws_private).write_message_job,frame_length);
  }
  else {
    websocket_local._4_4_ = CIO_OPERATION_NOT_PERMITTED;
  }
  return websocket_local._4_4_;
}

Assistant:

enum cio_error cio_websocket_write_message_first_chunk(struct cio_websocket *websocket, size_t frame_length, struct cio_write_buffer *payload, bool last_frame, bool is_binary, cio_websocket_write_handler_t handler, void *handler_context)
{

	if (cio_unlikely((websocket == NULL)) || (handler == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely(websocket->ws_private.write_message_job.wbh != NULL)) {
		return CIO_OPERATION_NOT_PERMITTED;
	}

	enum cio_websocket_frame_type kind = CIO_WEBSOCKET_TEXT_FRAME;

	if (websocket->ws_private.ws_flags.fragmented_write == 1U) {
		if (is_binary) {
			kind = CIO_WEBSOCKET_BINARY_FRAME;
		}

		if (!last_frame) {
			websocket->ws_private.ws_flags.fragmented_write = 0;
		}
	} else {
		if (last_frame) {
			websocket->ws_private.ws_flags.fragmented_write = 1;
		}

		kind = CIO_WEBSOCKET_CONTINUATION_FRAME;
	}

	websocket->ws_private.write_message_job.wbh = payload;
	websocket->ws_private.write_message_job.handler = handler;
	websocket->ws_private.write_message_job.handler_context = handler_context;
	websocket->ws_private.write_message_job.frame_type = kind;
	websocket->ws_private.write_message_job.last_frame = last_frame;
	websocket->ws_private.write_message_job.stream_handler = message_written;
	websocket->ws_private.write_message_job.is_continuation_chunk = false;

	return enqueue_job(websocket, &websocket->ws_private.write_message_job, frame_length);
}